

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
::destructor_impl(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *this)

{
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ != 0) {
    destroy_slots(this);
    dealloc(this);
    return;
  }
  return;
}

Assistant:

inline void destructor_impl() {
    if (capacity() == 0) return;
    if (is_soo()) {
      if (!empty()) {
        ABSL_SWISSTABLE_IGNORE_UNINITIALIZED(destroy(soo_slot()));
      }
      return;
    }
    destroy_slots();
    dealloc();
  }